

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

int alloc_mi(CommonModeInfoParams *mi_params)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  long in_RDI;
  int alloc_mi_size;
  int alloc_size_1d;
  int mi_grid_size;
  int aligned_mi_rows;
  
  iVar1 = calc_mi_size(*(int *)(in_RDI + 0xc));
  iVar2 = *(int *)(in_RDI + 0x3c) * iVar1;
  uVar3 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [*(byte *)(in_RDI + 0x28)];
  iVar4 = *(int *)(in_RDI + 0x24) * (iVar1 / (int)uVar3);
  if ((*(int *)(in_RDI + 0x20) < iVar4) || (*(int *)(in_RDI + 0x38) < iVar2)) {
    (**(code **)(in_RDI + 0x48))(in_RDI);
    pvVar5 = aom_calloc(CONCAT44(iVar1,iVar2),CONCAT44(uVar3,iVar4));
    *(void **)(in_RDI + 0x18) = pvVar5;
    if (*(long *)(in_RDI + 0x18) == 0) {
      return 1;
    }
    *(int *)(in_RDI + 0x20) = iVar4;
    pvVar5 = aom_calloc(CONCAT44(iVar1,iVar2),CONCAT44(uVar3,iVar4));
    *(void **)(in_RDI + 0x30) = pvVar5;
    if (*(long *)(in_RDI + 0x30) == 0) {
      return 1;
    }
    pvVar5 = aom_calloc(CONCAT44(iVar1,iVar2),CONCAT44(uVar3,iVar4));
    *(void **)(in_RDI + 0x40) = pvVar5;
    if (*(long *)(in_RDI + 0x40) == 0) {
      return 1;
    }
    *(int *)(in_RDI + 0x38) = iVar2;
  }
  return 0;
}

Assistant:

static int alloc_mi(CommonModeInfoParams *mi_params) {
  const int aligned_mi_rows = calc_mi_size(mi_params->mi_rows);
  const int mi_grid_size = mi_params->mi_stride * aligned_mi_rows;
  const int alloc_size_1d = mi_size_wide[mi_params->mi_alloc_bsize];
  const int alloc_mi_size =
      mi_params->mi_alloc_stride * (aligned_mi_rows / alloc_size_1d);

  if (mi_params->mi_alloc_size < alloc_mi_size ||
      mi_params->mi_grid_size < mi_grid_size) {
    mi_params->free_mi(mi_params);

    mi_params->mi_alloc =
        aom_calloc(alloc_mi_size, sizeof(*mi_params->mi_alloc));
    if (!mi_params->mi_alloc) return 1;
    mi_params->mi_alloc_size = alloc_mi_size;

    mi_params->mi_grid_base = (MB_MODE_INFO **)aom_calloc(
        mi_grid_size, sizeof(*mi_params->mi_grid_base));
    if (!mi_params->mi_grid_base) return 1;

    mi_params->tx_type_map =
        aom_calloc(mi_grid_size, sizeof(*mi_params->tx_type_map));
    if (!mi_params->tx_type_map) return 1;
    mi_params->mi_grid_size = mi_grid_size;
  }

  return 0;
}